

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_update_buffer(sg_buffer buf_id,sg_range *data)

{
  GLuint buffer;
  int iVar1;
  GLenum target;
  int iVar2;
  _sg_buffer_t *p_Var3;
  long lVar4;
  undefined4 in_register_0000003c;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c51,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  if (((data == (sg_range *)0x0) || (data->ptr == (void *)0x0)) || (data->size == 0)) {
    __assert_fail("data && data->ptr && (data->size > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c52,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  p_Var3 = _sg_lookup_buffer((_sg_pools_t *)CONCAT44(in_register_0000003c,buf_id.id),(uint32_t)data)
  ;
  if (((p_Var3 != (_sg_buffer_t *)0x0) && (data->size != 0)) &&
     ((p_Var3->slot).state == SG_RESOURCESTATE_VALID)) {
    if (data->ptr == (void *)0x0) {
      __assert_fail("buf && data && data->ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3778,
                    "_Bool _sg_validate_update_buffer(const _sg_buffer_t *, const sg_range *)");
    }
    _sg.validate_error = _SG_VALIDATE_SUCCESS;
    _sg_validate((p_Var3->cmn).usage != SG_USAGE_IMMUTABLE,_SG_VALIDATE_UPDATEBUF_USAGE);
    _sg_validate((int)data->size <= (p_Var3->cmn).size,_SG_VALIDATE_UPDATEBUF_SIZE);
    _sg_validate((p_Var3->cmn).update_frame_index != _sg.frame_index,_SG_VALIDATE_UPDATEBUF_ONCE);
    _sg_validate((p_Var3->cmn).append_frame_index != _sg.frame_index,_SG_VALIDATE_UPDATEBUF_APPEND);
    _sg_validate_end();
    if ((ulong)(long)(p_Var3->cmn).size < data->size) {
      __assert_fail("data->size <= (size_t)buf->cmn.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c56,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((p_Var3->cmn).update_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c58,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((p_Var3->cmn).append_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.append_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c5a,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((data->size == 0) || (data->ptr == (void *)0x0)) {
      __assert_fail("buf && data && data->ptr && (data->size > 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cd3,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    iVar1 = (p_Var3->cmn).active_slot + 1;
    iVar2 = 0;
    if (iVar1 < (p_Var3->cmn).num_slots) {
      iVar2 = iVar1;
    }
    (p_Var3->cmn).active_slot = iVar2;
    target = _sg_gl_buffer_target((p_Var3->cmn).type);
    lVar4 = (long)(p_Var3->cmn).active_slot;
    if (1 < lVar4) {
      __assert_fail("buf->cmn.active_slot < SG_NUM_INFLIGHT_FRAMES",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cd9,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    buffer = (p_Var3->gl).buf[lVar4];
    if (buffer == 0) {
      __assert_fail("gl_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cdb,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    iVar2 = glGetError();
    if (iVar2 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cdc,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    if (target == 0x8892) {
      _sg.gl.cache.stored_vertex_buffer = _sg.gl.cache.vertex_buffer;
    }
    else {
      _sg.gl.cache.stored_index_buffer = _sg.gl.cache.index_buffer;
    }
    _sg_gl_cache_bind_buffer(target,buffer);
    glBufferSubData(target,0,data->size,data->ptr);
    _sg_gl_cache_restore_buffer_binding(target);
    iVar2 = glGetError();
    if (iVar2 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1ce1,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    (p_Var3->cmn).update_frame_index = _sg.frame_index;
  }
  return;
}

Assistant:

inline void sg_update_buffer(sg_buffer buf_id, const sg_range& data) { return sg_update_buffer(buf_id, &data); }